

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_expression.hpp
# Opt level: O0

CollateExpression * __thiscall
duckdb::BaseExpression::Cast<duckdb::CollateExpression>(BaseExpression *this)

{
  string *msg;
  CollateExpression *in_RDI;
  allocator *this_00;
  allocator local_29;
  string local_28 [40];
  
  if ((in_RDI->super_ParsedExpression).super_BaseExpression.expression_class != COLLATE) {
    msg = (string *)__cxa_allocate_exception(0x10);
    this_00 = &local_29;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_28,"Failed to cast expression to type - expression type mismatch",this_00);
    InternalException::InternalException((InternalException *)this_00,msg);
    __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
  }
  return in_RDI;
}

Assistant:

const TARGET &Cast() const {
		if (expression_class != TARGET::TYPE) {
			throw InternalException("Failed to cast expression to type - expression type mismatch");
		}
		return reinterpret_cast<const TARGET &>(*this);
	}